

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEvent.cpp
# Opt level: O1

void __thiscall MidiEvent::MidiEvent(MidiEvent *this,char *filePath,long addr)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  FILE *__stream;
  char cVar7;
  
  *(undefined4 *)&(this->super_Event).byteLength = 0;
  (this->super_Event)._vptr_Event = (_func_int **)&PTR__Event_00106cb0;
  __stream = fopen(filePath,"rb");
  fseek(__stream,addr,0);
  iVar4 = getc(__stream);
  uVar2 = (uint8_t)iVar4;
  (this->super_Event).field_0x9 = uVar2;
  if ((char)uVar2 < '\0') {
    lastStatus = uVar2;
    (this->super_Event).byteLength = '\x01';
  }
  else {
    (this->super_Event).field_0x9 = lastStatus;
    fseek(__stream,-1,1);
  }
  uVar5 = (byte)(this->super_Event).field_0x9 - 0x80 >> 4;
  if (uVar5 < 7) {
    if ((0x4fU >> (uVar5 & 0x1f) & 1) == 0) {
      iVar4 = getc(__stream);
      uVar3 = (ushort)iVar4;
      cVar7 = '\x01';
    }
    else {
      iVar4 = getc(__stream);
      iVar6 = getc(__stream);
      uVar3 = (ushort)iVar6 | (ushort)(iVar4 << 8);
      cVar7 = '\x02';
    }
    *(ushort *)&(this->super_Event).field_0xa = uVar3;
    puVar1 = &(this->super_Event).byteLength;
    *puVar1 = *puVar1 + cVar7;
  }
  fclose(__stream);
  return;
}

Assistant:

MidiEvent::MidiEvent(const char* filePath, long addr) {
	FILE* f = fopen(filePath, "rb");
	fseek(f, addr, SEEK_SET);
	this->status = getc(f);

	if (status & 0x80u) {
		lastStatus = status;
		byteLength = 1;
	} else {
		status = lastStatus;
		fseek(f, -1, SEEK_CUR);
	}

	switch (status & 0xF0u) {
		case 0xC0:
		case 0xD0:
			data = getc(f);
			++byteLength;
			break;
		case 0x80:
		case 0x90:
		case 0xA0:
		case 0xB0:
		case 0xE0:
			data = getc(f) << 8u | getc(f);
			byteLength += 2;
			break;
	}

	fclose(f);
}